

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  int out_size;
  void *out;
  int local_44;
  void *local_40 [2];
  
  if (size < this->buffer_size_) {
    while( true ) {
      iVar3 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                        (this,local_40,&local_44);
      cVar1 = (char)iVar3;
      if (cVar1 == '\0') break;
      if (size <= local_44) {
        memcpy(local_40[0],data,(long)size);
        (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                  (this,(ulong)(uint)(local_44 - size));
        return (bool)cVar1;
      }
      memcpy(local_40[0],data,(long)local_44);
      data = (void *)((long)data + (long)local_44);
      size = size - local_44;
    }
  }
  else {
    bVar2 = WriteBuffer(this);
    if ((bVar2) &&
       (iVar3 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,data,(ulong)(uint)size), (char)iVar3 != '\0')) {
      psVar4 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (this->buffer_used_,0,"buffer_used_ == 0");
      if (psVar4 == (string *)0x0) {
        this->position_ = this->position_ + (long)size;
        return true;
      }
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x14f,psVar4->_M_string_length,(psVar4->_M_dataplus)._M_p);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_40);
    }
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}